

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rs_projections.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = testRSDoubleLinProjection();
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"rsDoubleLinProjection test passed\n",0x22);
    bVar1 = testRSSingleLinProjection();
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"rsSingleLinProjection test passed\n",0x22);
      return 0;
    }
    pcVar2 = "rsSingleLinProjection test did not pass\n";
  }
  else {
    pcVar2 = "rsDoubleLinProjection test did not pass\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,0x28);
  return 1;
}

Assistant:

int main(int argc, char ** argv){

if(testRSDoubleLinProjection()){
    std::cout << "rsDoubleLinProjection test passed\n";
}else{
    std::cerr << "rsDoubleLinProjection test did not pass\n";
    return 1;
};

if(testRSSingleLinProjection()){
    std::cout << "rsSingleLinProjection test passed\n";
}else{
    std::cerr << "rsSingleLinProjection test did not pass\n";
    return 1;
};

return 0;
}